

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall
lzham::lzcompressor::node::add_state
          (node *this,int parent_index,int parent_state_index,lzdecision *lzdec,state *parent_state,
          bit_cost_t total_cost,uint total_complexity)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *in_RCX;
  long lVar4;
  uint *puVar5;
  undefined4 in_EDX;
  undefined4 in_ESI;
  uint *in_RDI;
  state_base *in_R8;
  ulong in_R9;
  uint in_stack_00000008;
  node_state *pNew_node_state;
  uint num_to_move;
  uint num_behind;
  node_state *cur_node_state_1;
  int insert_index;
  node_state *cur_node_state;
  int i;
  state_base trial_state;
  uint local_80;
  uint local_7c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  state_base *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  node_state *__a;
  uint local_44;
  state_base local_40;
  ulong local_28;
  undefined8 *local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_28 = in_R9;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  state_base::save_partial_state(in_R8,&local_40);
  state_base::partial_advance
            (in_stack_ffffffffffffffa0,
             (lzdecision *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_44 = *in_RDI;
  while( true ) {
    local_44 = local_44 - 1;
    if ((int)local_44 < 0) break;
    __a = (node_state *)(in_RDI + (long)(int)local_44 * 0xe + 2);
    bVar2 = state_base::operator==(&__a->m_saved_state,&local_40);
    if (bVar2) {
      if ((local_28 < __a->m_total_cost) ||
         ((local_28 == __a->m_total_cost && (in_stack_00000008 < __a->m_total_complexity)))) {
        __a->m_parent_index = (int16)local_c;
        __a->m_parent_state_index = (int8)local_10;
        uVar1 = *local_18;
        (__a->m_lzdec).m_pos = (int)uVar1;
        (__a->m_lzdec).m_len = (int)((ulong)uVar1 >> 0x20);
        (__a->m_lzdec).m_dist = *(int *)(local_18 + 1);
        __a->m_total_cost = local_28;
        __a->m_total_complexity = in_stack_00000008;
        while ((0 < (int)local_44 &&
               ((*(ulong *)(in_RDI + (long)(int)local_44 * 0xe + 0xc) <
                 *(ulong *)(in_RDI + (long)(int)(local_44 - 1) * 0xe + 0xc) ||
                ((*(long *)(in_RDI + (long)(int)local_44 * 0xe + 0xc) ==
                  *(long *)(in_RDI + (long)(int)(local_44 - 1) * 0xe + 0xc) &&
                 (in_RDI[(long)(int)local_44 * 0xe + 0xe] <
                  in_RDI[(long)(int)(local_44 - 1) * 0xe + 0xe]))))))) {
          std::swap<lzham::lzcompressor::node_state>
                    (__a,(node_state *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                    );
          local_44 = local_44 - 1;
        }
      }
      return;
    }
  }
  uVar3 = *in_RDI;
  while (((0 < (int)uVar3 &&
          (lVar4 = (long)(int)(uVar3 - 1), local_28 <= *(ulong *)(in_RDI + lVar4 * 0xe + 0xc))) &&
         ((local_28 != *(ulong *)(in_RDI + lVar4 * 0xe + 0xc) ||
          (in_stack_00000008 < in_RDI[lVar4 * 0xe + 0xe]))))) {
    uVar3 = uVar3 - 1;
  }
  if (uVar3 == 4) {
    return;
  }
  local_7c = *in_RDI - uVar3;
  if (3 < *in_RDI) {
    local_7c = local_7c - 1;
  }
  if (local_7c != 0) {
    memmove(in_RDI + (long)(int)(uVar3 + 1) * 0xe + 2,in_RDI + (long)(int)uVar3 * 0xe + 2,
            (ulong)local_7c * 0x38);
  }
  puVar5 = in_RDI + (long)(int)uVar3 * 0xe + 2;
  *(undefined2 *)(puVar5 + 0xd) = (undefined2)local_c;
  *(undefined1 *)((long)puVar5 + 0x36) = (undefined1)local_10;
  *(undefined8 *)puVar5 = *local_18;
  puVar5[2] = *(uint *)(local_18 + 1);
  *(ulong *)(puVar5 + 10) = local_28;
  puVar5[0xc] = in_stack_00000008;
  puVar5[3] = local_40.m_cur_ofs;
  puVar5[4] = local_40.m_cur_state;
  *(undefined8 *)(puVar5 + 5) = local_40.m_match_hist._0_8_;
  *(undefined8 *)(puVar5 + 7) = local_40.m_match_hist._8_8_;
  if (*in_RDI + 1 < 4) {
    local_80 = *in_RDI + 1;
  }
  else {
    local_80 = 4;
  }
  *in_RDI = local_80;
  return;
}

Assistant:

void lzcompressor::node::add_state(
      int parent_index, int parent_state_index,
      const lzdecision &lzdec, state &parent_state,
      bit_cost_t total_cost,
      uint total_complexity)
   {
      state_base trial_state;
      parent_state.save_partial_state(trial_state);
      trial_state.partial_advance(lzdec);

      for (int i = m_num_node_states - 1; i >= 0; i--)
      {
         node_state &cur_node_state = m_node_states[i];
         if (cur_node_state.m_saved_state == trial_state)
         {
            if ( (total_cost < cur_node_state.m_total_cost) ||
                 ((total_cost == cur_node_state.m_total_cost) && (total_complexity < cur_node_state.m_total_complexity)) )
            {
               cur_node_state.m_parent_index = static_cast<int16>(parent_index);
               cur_node_state.m_parent_state_index = static_cast<int8>(parent_state_index);
               cur_node_state.m_lzdec = lzdec;
               cur_node_state.m_total_cost = total_cost;
               cur_node_state.m_total_complexity = total_complexity;

               while (i > 0)
               {
                  if ((m_node_states[i].m_total_cost < m_node_states[i - 1].m_total_cost) ||
                      ((m_node_states[i].m_total_cost == m_node_states[i - 1].m_total_cost) && (m_node_states[i].m_total_complexity < m_node_states[i - 1].m_total_complexity)))
                  {
                     std::swap(m_node_states[i], m_node_states[i - 1]);
                     i--;
                  }
                  else
                     break;
               }
            }

            return;
         }
      }

      int insert_index;
      for (insert_index = m_num_node_states; insert_index > 0; insert_index--)
      {
         node_state &cur_node_state = m_node_states[insert_index - 1];

         if ( (total_cost > cur_node_state.m_total_cost) ||
              ((total_cost == cur_node_state.m_total_cost) && (total_complexity >= cur_node_state.m_total_complexity)) )
         {
            break;
         }
      }

      if (insert_index == cMaxNodeStates)
         return;

      uint num_behind = m_num_node_states - insert_index;
      uint num_to_move = (m_num_node_states < cMaxNodeStates) ? num_behind : (num_behind - 1);
      if (num_to_move)
      {
         LZHAM_ASSERT((insert_index + 1 + num_to_move) <= cMaxNodeStates);
         memmove( &m_node_states[insert_index + 1], &m_node_states[insert_index], sizeof(node_state) * num_to_move);
      }

      node_state *pNew_node_state = &m_node_states[insert_index];
      pNew_node_state->m_parent_index = static_cast<int16>(parent_index);
      pNew_node_state->m_parent_state_index = static_cast<uint8>(parent_state_index);
      pNew_node_state->m_lzdec = lzdec;
      pNew_node_state->m_total_cost = total_cost;
      pNew_node_state->m_total_complexity = total_complexity;
      pNew_node_state->m_saved_state = trial_state;

      m_num_node_states = LZHAM_MIN(m_num_node_states + 1, cMaxNodeStates);

#ifdef LZHAM_LZVERIFY
      for (uint i = 0; i < (m_num_node_states - 1); ++i)
      {
         node_state &a = m_node_states[i];
         node_state &b = m_node_states[i + 1];
         LZHAM_VERIFY(
            (a.m_total_cost < b.m_total_cost) ||
            ((a.m_total_cost == b.m_total_cost) && (a.m_total_complexity <= b.m_total_complexity)) );
      }
#endif
   }